

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::
     DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (undefined8 param_1,long *param_2,ostream *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"{",1);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*param_2;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2[1];
  if (value != pbVar1) {
    lVar2 = 0;
    do {
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_3,",",1), lVar2 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_3," ...",4);
        goto LAB_001201cc;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
      iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Print(value,param_3);
      value = value + 1;
      lVar2 = lVar2 + 1;
    } while (value != pbVar1);
    if (lVar2 != 0) {
LAB_001201cc:
      std::__ostream_insert<char,std::char_traits<char>>(param_3," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_3,"}",1);
  return;
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}